

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O0

Mvc_Cube_t *
Mvc_CoverSortMerge(Mvc_Cube_t *pList1,Mvc_Cube_t *pList2,Mvc_Cube_t *pMask,
                  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int iVar1;
  Mvc_Cube_t *local_50;
  Mvc_Cube_t *local_40;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t **ppTail;
  Mvc_Cube_t *pList;
  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc_local;
  Mvc_Cube_t *pMask_local;
  Mvc_Cube_t *pList2_local;
  Mvc_Cube_t *pList1_local;
  
  ppTail = (Mvc_Cube_t **)0x0;
  pCube = (Mvc_Cube_t *)&ppTail;
  pList = (Mvc_Cube_t *)pCompareFunc;
  pCompareFunc_local = (_func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *)pMask;
  pMask_local = pList2;
  pList2_local = pList1;
  while (pList2_local != (Mvc_Cube_t *)0x0 && pMask_local != (Mvc_Cube_t *)0x0) {
    iVar1 = (*(code *)pList)(pList2_local,pMask_local,pCompareFunc_local);
    if (iVar1 < 0) {
      local_40 = pList2_local;
      pList2_local = pList2_local->pNext;
    }
    else {
      local_40 = pMask_local;
      pMask_local = pMask_local->pNext;
    }
    pCube->pNext = local_40;
    pCube = local_40;
  }
  if (pList2_local == (Mvc_Cube_t *)0x0) {
    local_50 = pMask_local;
  }
  else {
    local_50 = pList2_local;
  }
  pCube->pNext = local_50;
  return (Mvc_Cube_t *)ppTail;
}

Assistant:

Mvc_Cube_t * Mvc_CoverSortMerge( Mvc_Cube_t * pList1, Mvc_Cube_t * pList2, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pList = NULL, ** ppTail = &pList;
    Mvc_Cube_t * pCube;
    while ( pList1 && pList2 )
    {
        if ( pCompareFunc( pList1, pList2, pMask ) < 0 )
        {
            pCube = pList1;
            pList1 = Mvc_CubeReadNext(pList1);
        }
        else
        {
            pCube = pList2;
            pList2 = Mvc_CubeReadNext(pList2);
        }
        *ppTail = pCube;
        ppTail = Mvc_CubeReadNextP(pCube);
    }
    *ppTail = pList1? pList1: pList2;
    return pList;
}